

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlist.c
# Opt level: O3

int main(void)

{
  rlist **pprVar1;
  rlist *prVar2;
  rlist rVar3;
  rlist *prVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  rlist *prVar8;
  test *ptVar9;
  int iVar10;
  bool bVar11;
  rlist tmp;
  rlist empty_list;
  
  plan(0x68);
  _space(_stdout);
  lVar6 = 0;
  printf("# *** %s ***\n","main");
  _ok((uint)(head.prev == &head && head.next == &head),"rlist_empty(&head)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x1a,
      "list is empty");
  ptVar9 = items;
  do {
    prVar8 = &ptVar9->list;
    *(int *)((long)(prVar8 + -1) + 8) = (int)lVar6;
    prVar8->next = &head;
    prVar4 = head.prev;
    prVar8->prev = head.prev;
    prVar4->next = prVar8;
    prVar8->next->prev = prVar8;
    lVar6 = lVar6 + 1;
    ptVar9 = (test *)(prVar8 + 1);
  } while (lVar6 != 7);
  pprVar1 = &tmp.next;
  empty_list.prev = (rlist *)pprVar1;
  tmp.next = (rlist *)pprVar1;
  _ok(1,"rlist_empty(&empty_list)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x20,
      "rlist_nil is empty");
  _ok((uint)(head2.prev == &head2 && head2.next == &head2),"rlist_empty(&head2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x21,
      "head2 is empty");
  rVar3 = head2;
  head2 = stack0xffffffffffffffb8;
  stack0xffffffffffffffb8 = rVar3;
  empty_list.prev = rVar3.next;
  bVar11 = empty_list.prev == &head2;
  prVar4 = empty_list.prev;
  unique0x100018b2 = rVar3;
  if (bVar11) {
    tmp.next = rVar3.prev;
    empty_list.prev = (rlist *)pprVar1;
    prVar4 = (rlist *)pprVar1;
  }
  prVar4->prev = (rlist *)pprVar1;
  (tmp.next)->next = (rlist *)pprVar1;
  prVar4 = head2.next;
  if (head2.next == (rlist *)pprVar1) {
    prVar4 = &head2;
    head2.next = &head2;
  }
  prVar4->prev = &head2;
  (head2.prev)->next = &head2;
  _ok((uint)((rlist *)pprVar1 == empty_list.prev && tmp.next == empty_list.prev),
      "rlist_empty(&empty_list)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x23,
      "rlist_nil is empty after swap");
  _ok((uint)(head2.prev == &head2 && head2.next == &head2),"rlist_empty(&head2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x24,
      "head2 is empty after swap");
  rVar3 = head;
  head = head2;
  head2 = rVar3;
  head2.next = rVar3.next;
  bVar11 = head2.next == &head;
  prVar4 = head2.next;
  head2 = rVar3;
  if (bVar11) {
    prVar4 = &head2;
    head2.prev = rVar3.prev;
    head2.next = &head2;
  }
  prVar4->prev = &head2;
  (head2.prev)->next = &head2;
  prVar4 = head.next;
  if (head.next == &head2) {
    prVar4 = &head;
    head.next = &head;
  }
  prVar4->prev = &head;
  prVar4 = head.prev;
  (head.prev)->next = &head;
  lVar6 = 0;
  _ok((uint)(prVar4 == &head && head.next == &head),"rlist_empty(&head)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x26,
      "head is empty after swap");
  ptVar9 = items;
  _ok((uint)(head2.next == &items[0].list),"rlist_first(&head2) == &items[0].list",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x27,
      "first item");
  _ok((uint)(head2.prev == &items[6].list),"rlist_last(&head2) == &items[ITEMS - 1].list",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x28,
      "last item");
  if (head2.next != &head2) {
    lVar6 = 0;
    uVar7 = 0;
    prVar4 = head2.next;
    do {
      _ok((uint)(&ptVar9->list == prVar4),"rlist == &items[i].list",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x2b,
          "element (foreach) %d",uVar7,(undefined1  [16])rVar3);
      prVar4 = prVar4->next;
      uVar7 = (ulong)((int)uVar7 + 1);
      ptVar9 = (test *)(&ptVar9->list + 1);
      lVar6 = lVar6 + 0x100000000;
    } while (prVar4 != &head2);
    lVar6 = lVar6 >> 0x20;
  }
  if (head2.prev != &head2) {
    uVar5 = (uint)lVar6;
    prVar8 = (rlist *)(&completed_0 + lVar6 * 0x18);
    prVar4 = head2.prev;
    do {
      uVar5 = uVar5 - 1;
      _ok((uint)(prVar8 == prVar4),"rlist == &items[i].list",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x30,
          "element (foreach_reverse) %d",(ulong)uVar5);
      prVar4 = prVar4->prev;
      prVar8 = (rlist *)&prVar8[-2].next;
    } while (prVar4 != &head2);
  }
  rVar3 = head2;
  head2 = head;
  head = rVar3;
  head.next = rVar3.next;
  bVar11 = head.next == &head2;
  prVar4 = head.next;
  head = rVar3;
  if (bVar11) {
    head.prev = rVar3.prev;
    head.next = &head;
    prVar4 = &head;
  }
  prVar4->prev = &head;
  (head.prev)->next = &head;
  prVar4 = head2.next;
  if (head2.next == &head) {
    head2.next = &head2;
    prVar4 = &head2;
  }
  prVar4->prev = &head2;
  (head2.prev)->next = &head2;
  ptVar9 = items;
  lVar6 = 0;
  _ok((uint)(head.next == &items[0].list),"rlist_first(&head) == &items[0].list",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x35,
      "first item");
  _ok((uint)(head.next != &items[6].list),"rlist_first(&head) != &items[ITEMS - 1].list",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x36,
      "first item");
  _ok((uint)(head.prev == &items[6].list),"rlist_last(&head) == &items[ITEMS - 1].list",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x38,
      "last item");
  _ok((uint)(head.prev != &items[0].list),"rlist_last(&head) != &items[0].list",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x39,
      "last item");
  _ok((uint)(head.next == &items[0].list),"rlist_next(&head) == &items[0].list",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x3b,
      "rlist_next");
  _ok((uint)(head.prev == &items[6].list),"rlist_prev(&head) == &items[ITEMS - 1].list",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x3c,
      "rlist_prev");
  if (head.next != &head) {
    lVar6 = 0;
    uVar7 = 0;
    prVar4 = head.next;
    do {
      _ok((uint)(&ptVar9->list == prVar4),"rlist == &items[i].list",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x40,
          "element (foreach) %d",uVar7);
      prVar4 = prVar4->next;
      uVar7 = (ulong)((int)uVar7 + 1);
      ptVar9 = (test *)(&ptVar9->list + 1);
      lVar6 = lVar6 + 0x100000000;
    } while (prVar4 != &head);
    lVar6 = lVar6 >> 0x20;
  }
  if (head.prev != &head) {
    uVar5 = (uint)lVar6;
    prVar8 = (rlist *)(&completed_0 + lVar6 * 0x18);
    prVar4 = head.prev;
    do {
      uVar5 = uVar5 - 1;
      _ok((uint)(prVar8 == prVar4),"rlist == &items[i].list",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x45,
          "element (foreach_reverse) %d",(ulong)uVar5);
      prVar4 = prVar4->prev;
      prVar8 = (rlist *)&prVar8[-2].next;
    } while (prVar4 != &head);
  }
  uVar5 = 0;
  _ok(1,"rlist_entry(&items[0].list, struct test, list) == &items[0]",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x4a,
      "rlist_entry");
  ptVar9 = items;
  _ok((uint)(head.next == &items[0].list),"rlist_first_entry(&head, struct test, list) == &items[0]"
      ,"/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x4c,
      "rlist_first_entry");
  _ok((uint)(items[0].list.next == &items[1].list),"rlist_next_entry(&items[0], list) == &items[1]",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x4d,
      "rlist_next_entry");
  _ok((uint)(items[2].list.prev == &items[1].list),"rlist_prev_entry(&items[2], list) == &items[1]",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x4e,
      "rlist_prev_entry");
  if (head.next != &head) {
    uVar5 = 0;
    prVar4 = head.next;
    do {
      _ok((uint)(ptVar9 == (test *)&prVar4[-1].next),"it == items + i",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x53,
          "element (foreach_entry) %d",(ulong)uVar5);
      prVar4 = prVar4->next;
      uVar5 = uVar5 + 1;
      ptVar9 = ptVar9 + 1;
    } while (prVar4 != &head);
  }
  if (head.prev != &head) {
    ptVar9 = items + (int)uVar5;
    prVar4 = head.prev;
    do {
      ptVar9 = ptVar9 + -1;
      uVar5 = uVar5 - 1;
      _ok((uint)(ptVar9 == (test *)&prVar4[-1].next),"it == items + i",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x58,
          "element (foreach_entry_reverse) %d",(ulong)uVar5);
      prVar4 = prVar4->prev;
    } while (prVar4 != &head);
  }
  (items[2].list.prev)->next = items[2].list.next;
  (items[2].list.next)->prev = items[2].list.prev;
  items[2].list.next = &items[2].list;
  items[2].list.prev = &items[2].list;
  _ok((uint)(head2.prev == &head2 && head2.next == &head2),"rlist_empty(&head2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x5c,
      "head2 is empty");
  (items[3].list.prev)->next = items[3].list.next;
  (items[3].list.next)->prev = items[3].list.prev;
  items[3].list.prev = &head2;
  prVar4 = head2.next;
  items[3].list.next = head2.next;
  head2.next = &items[3].list;
  prVar4->prev = (rlist *)0x1050e0;
  _ok(1,"!rlist_empty(&head2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x5e,
      "head2 isnt empty");
  _ok((uint)(head2.next == &items[3].list),
      "rlist_first_entry(&head2, struct test, list) == &items[3]",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x60,
      "Item was moved");
  (items[4].list.prev)->next = items[4].list.next;
  (items[4].list.next)->prev = items[4].list.prev;
  items[4].list.next = &head2;
  items[4].list.prev = head2.prev;
  (head2.prev)->next = &items[4].list;
  (items[4].list.next)->prev = (rlist *)0x1050f8;
  prVar4 = head.next;
  if (head.next != &head) {
    do {
      _ok((uint)((test *)&prVar4[-1].next == items + (int)uVar5),"it == items + i",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",99,
          "element (second deleted) %d",(ulong)uVar5);
      uVar5 = uVar5 + 1;
      if (uVar5 == 2) {
        uVar5 = 5;
      }
      pprVar1 = &prVar4->next;
      prVar4 = *pprVar1;
    } while (*pprVar1 != &head);
  }
  prVar4 = head.prev;
  if (head.prev != &head) {
    do {
      uVar5 = uVar5 - 1;
      if (uVar5 == 4) {
        uVar5 = 1;
      }
      _ok((uint)((test *)&prVar4[-1].next == items + (int)uVar5),"it == items + i",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x6c,
          "element (second deleted) %d");
      pprVar1 = &prVar4->prev;
      prVar4 = *pprVar1;
    } while (*pprVar1 != &head);
  }
  head.next = &head;
  head.prev = &head;
  lVar6 = 0;
  _ok(1,"rlist_empty(&head)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x71,
      "list is empty");
  prVar4 = (rlist *)&completed_0;
  prVar8 = head.next;
  do {
    *(int *)((long)prVar4 + 0x10) = (int)lVar6;
    *(rlist **)((long)prVar4 + 0x18) = &head;
    *(rlist **)((long)prVar4 + 0x20) = prVar8;
    prVar4 = (rlist *)((long)prVar4 + 0x18);
    prVar8->prev = prVar4;
    lVar6 = lVar6 + 1;
    prVar8 = prVar4;
  } while (lVar6 != 7);
  head.next = prVar4;
  lVar6 = 0;
  if (head.prev != &head) {
    ptVar9 = items;
    lVar6 = 0;
    uVar7 = 0;
    prVar4 = head.prev;
    do {
      _ok((uint)(ptVar9 == (test *)&prVar4[-1].next),"it == items + i",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x78,
          "element (foreach_entry_reverse) %d",uVar7);
      prVar4 = prVar4->prev;
      uVar7 = (ulong)((int)uVar7 + 1);
      ptVar9 = ptVar9 + 1;
      lVar6 = lVar6 + 0x100000000;
    } while (prVar4 != &head);
    lVar6 = lVar6 >> 0x20;
    prVar4 = head.next;
  }
  if (prVar4 != &head) {
    uVar5 = (uint)lVar6;
    ptVar9 = items + lVar6;
    do {
      uVar5 = uVar5 - 1;
      ptVar9 = ptVar9 + -1;
      _ok((uint)(ptVar9 == (test *)&prVar4[-1].next),"it == items + i",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x7d,
          "element (foreach_entry) %d",(ulong)uVar5);
      prVar4 = prVar4->next;
    } while (prVar4 != &head);
  }
  items[0].list.prev = &head;
  items[0].list.next = &head;
  head.next = &items[0].list;
  head.prev = &items[0].list;
  lVar6 = 0;
  _ok(1,"rlist_prev_entry_safe(&items[0], &head, list) == NULL",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x82,
      "prev is null");
  head.next = &head;
  head.prev = &head;
  _ok(1,"i == 0","/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",
      0x88,"list is empty");
  prVar4 = (rlist *)&completed_0;
  prVar8 = head.next;
  do {
    *(int *)((long)prVar4 + 0x10) = (int)lVar6;
    *(rlist **)((long)prVar4 + 0x18) = &head;
    *(rlist **)((long)prVar4 + 0x20) = prVar8;
    prVar4 = (rlist *)((long)prVar4 + 0x18);
    prVar8->prev = prVar4;
    lVar6 = lVar6 + 1;
    prVar8 = prVar4;
  } while (lVar6 != 7);
  head.next = prVar4;
  if (head.prev != &head) {
    ptVar9 = items;
    uVar7 = 0;
    prVar4 = head.prev;
    do {
      prVar8 = prVar4->prev;
      prVar2 = prVar4->next;
      prVar8->next = prVar2;
      prVar2->prev = prVar8;
      prVar4->next = prVar4;
      prVar4->prev = prVar4;
      _ok((uint)(ptVar9 == (test *)&prVar4[-1].next),"it == items + i",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x90,
          "element (reverse) %d",uVar7);
      uVar7 = (ulong)((int)uVar7 + 1);
      ptVar9 = ptVar9 + 1;
      prVar4 = prVar8;
    } while (prVar8 != &head);
    prVar4 = head.next;
  }
  items[0].list.prev = &head;
  head.next = &items[0].list;
  items[0].list.next = prVar4;
  prVar4->prev = (rlist *)0x105098;
  if (head2.next != &items[0].list) {
    head.next = &items[0].list;
    items[0].list.prev = &head;
  }
  head2.next = &head2;
  head2.prev = &head2;
  lVar6 = 0;
  iVar10 = 1;
  _ok(1,"rlist_empty(&head2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x95,
      "list is empty");
  ptVar9 = items;
  do {
    prVar8 = (rlist *)((long)&items[1].list.prev + lVar6);
    *(int *)((long)&items[1].no + lVar6) = iVar10;
    *(rlist **)((long)&items[1].list.next + lVar6) = &head;
    prVar4 = head.prev;
    prVar8->prev = head.prev;
    prVar4->next = prVar8;
    **(undefined8 **)((long)&items[1].list.next + lVar6) = prVar8;
    iVar10 = iVar10 + 1;
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x90);
  head2.prev = &head2;
  prVar4 = head2.prev;
  head2.prev = &head2;
  if (head2.next == head.next) {
    uVar5 = 1;
  }
  else {
    head2.prev = prVar4;
    (head.next)->prev = &head;
    uVar5 = (uint)(head2.prev == &head2);
  }
  head2.next = &head2;
  _ok(uVar5,"rlist_empty(&head2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x9b,
      "list is empty");
  if (head2.next == &items[3].list) {
    head2.next = &head2;
    head2.prev = &head2;
    uVar7 = 0;
  }
  else {
    head2.next = head.next;
    (head.next)->prev = &head2;
    head2.prev = items[3].list.prev;
    (items[3].list.prev)->next = &head2;
    head.next = &items[3].list;
    items[3].list.prev = &head;
    if (head2.next == &head2) {
      uVar7 = 0;
      prVar4 = &items[3].list;
      goto LAB_0010211b;
    }
    uVar7 = 0;
    prVar4 = head2.next;
    do {
      _ok((uint)(ptVar9 == (test *)&prVar4[-1].next),"it == items + i",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0x9f,
          "element (first half) %d",uVar7 & 0xffffffff);
      uVar7 = uVar7 + 1;
      prVar4 = prVar4->next;
      ptVar9 = ptVar9 + 1;
    } while (prVar4 != &head2);
    uVar7 = uVar7 & 0xffffffff;
  }
  prVar4 = head.next;
LAB_0010211b:
  if (prVar4 != &head) {
    ptVar9 = items + uVar7;
    do {
      _ok((uint)(ptVar9 == (test *)&prVar4[-1].next),"it == items + i",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rlist.c",0xa3,
          "element (second half) %d",uVar7);
      prVar4 = prVar4->next;
      uVar7 = (ulong)((int)uVar7 + 1);
      ptVar9 = ptVar9 + 1;
    } while (prVar4 != &head);
  }
  _space(_stdout);
  printf("# *** %s: done ***\n","main");
  iVar10 = check_plan();
  return iVar10;
}

Assistant:

int
main(void)
{
	int i;
	struct test *it, *tmp;
	struct rlist *rlist;

	plan(104);
	header();

	ok(rlist_empty(&head), "list is empty");
	for (i = 0; i < ITEMS; i++) {
		items[i].no = i;
		rlist_add_tail(&head, &(items[i].list));
	}
	RLIST_HEAD(empty_list);
	ok(rlist_empty(&empty_list), "rlist_nil is empty");
	ok(rlist_empty(&head2), "head2 is empty");
	rlist_swap(&head2, &empty_list);
	ok(rlist_empty(&empty_list), "rlist_nil is empty after swap");
	ok(rlist_empty(&head2), "head2 is empty after swap");
	rlist_swap(&head, &head2);
	ok(rlist_empty(&head), "head is empty after swap");
	is(rlist_first(&head2), &items[0].list, "first item");
	is(rlist_last(&head2), &items[ITEMS - 1].list, "last item");
	i = 0;
	rlist_foreach(rlist, &head2) {
		is(rlist, &items[i].list, "element (foreach) %d", i);
		i++;
	}
	rlist_foreach_reverse(rlist, &head2) {
		i--;
		is(rlist, &items[i].list, "element (foreach_reverse) %d", i);
	}
	rlist_swap(&head2, &head);


	is(rlist_first(&head), &items[0].list, "first item");
	isnt(rlist_first(&head), &items[ITEMS - 1].list, "first item");

	is(rlist_last(&head), &items[ITEMS - 1].list, "last item");
	isnt(rlist_last(&head), &items[0].list, "last item");

	is(rlist_next(&head), &items[0].list, "rlist_next");
	is(rlist_prev(&head), &items[ITEMS - 1].list, "rlist_prev");

	i = 0;
	rlist_foreach(rlist, &head) {
		is(rlist, &items[i].list, "element (foreach) %d", i);
		i++;
	}
	rlist_foreach_reverse(rlist, &head) {
		i--;
		is(rlist, &items[i].list, "element (foreach_reverse) %d", i);
	}


	is(rlist_entry(&items[0].list, struct test, list), &items[0],
		"rlist_entry");
	is(rlist_first_entry(&head, struct test, list), &items[0],
		"rlist_first_entry");
	is(rlist_next_entry(&items[0], list), &items[1], "rlist_next_entry");
	is(rlist_prev_entry(&items[2], list), &items[1], "rlist_prev_entry");


	i = 0;
	rlist_foreach_entry(it, &head, list) {
		is(it, items + i, "element (foreach_entry) %d", i);
		i++;
	}
	rlist_foreach_entry_reverse(it, &head, list) {
		i--;
		is(it, items + i, "element (foreach_entry_reverse) %d", i);
	}

	rlist_del(&items[2].list);
	ok(rlist_empty(&head2), "head2 is empty");
	rlist_move(&head2, &items[3].list);
	ok(!rlist_empty(&head2), "head2 isnt empty");
	is(rlist_first_entry(&head2, struct test, list),
					&items[3], "Item was moved");
	rlist_move_tail(&head2, &items[4].list);
	rlist_foreach_entry(it, &head, list) {
		is(it, items + i, "element (second deleted) %d", i);
		i++;
		if (i == 2)
			i += 3;
	}
	rlist_foreach_entry_reverse(it, &head, list) {
		i--;
		if (i == 4)
			i -= 3;
		is(it, items + i, "element (second deleted) %d", i);
	}


	rlist_create(&head);
	ok(rlist_empty(&head), "list is empty");
	for (i = 0; i < ITEMS; i++) {
		items[i].no = i;
		rlist_add(&head, &(items[i].list));
	}
	i = 0;
	rlist_foreach_entry_reverse(it, &head, list) {
		is(it, items + i, "element (foreach_entry_reverse) %d", i);
		i++;
	}
	rlist_foreach_entry(it, &head, list) {
		i--;
		is(it, items + i, "element (foreach_entry) %d", i);
	}
	rlist_create(&head);
	rlist_add_entry(&head, &items[0], list);
	ok(rlist_prev_entry_safe(&items[0], &head, list) == NULL,
	   "prev is null");

	rlist_create(&head);
	i = 0;
	rlist_foreach_entry_safe_reverse(it, &head, list, tmp)
		++i;
	ok(i == 0, "list is empty");
	for (i = 0; i < ITEMS; i++) {
		items[i].no = i;
		rlist_add(&head, &(items[i].list));
	}
	i = 0;
	rlist_foreach_entry_safe_reverse(it, &head, list, tmp) {
		rlist_del_entry(it, list);
		is(it, items + i, "element (reverse) %d", i);
		i++;
	}
	rlist_add(&head, &items[0].list);
	rlist_cut_before(&head2, &head, head.next);
	ok(rlist_empty(&head2), "list is empty");
	for (i = 1; i < ITEMS; i++) {
		items[i].no = i;
		rlist_add_tail(&head, &(items[i].list));
	}
	rlist_cut_before(&head2, &head, head.next);
	ok(rlist_empty(&head2), "list is empty");
	rlist_cut_before(&head2, &head, &items[ITEMS / 2].list);
	i = 0;
	rlist_foreach_entry(it, &head2, list) {
		is(it, items + i, "element (first half) %d", i);
		i++;
	}
	rlist_foreach_entry(it, &head, list) {
		is(it, items + i, "element (second half) %d", i);
		i++;
	}

	footer();
	return check_plan();
}